

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
TagVisitor<CustomCommandsTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
::~TagVisitor(TagVisitor<CustomCommandsTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              *this)

{
  cmTarget *target;
  cmake *cm;
  TagVisitor<CustomCommandsTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  *this_local;
  
  target = this->Target;
  cm = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
  reportBadObjLib(&this->BadObjLibFiles,target,cm);
  cmsys::RegularExpression::~RegularExpression(&this->Header);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector(&this->BadObjLibFiles);
  return;
}

Assistant:

~TagVisitor()
  {
    reportBadObjLib(this->BadObjLibFiles, this->Target,
                    this->GlobalGenerator->GetCMakeInstance());
  }